

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O1

Vector4 ColorNormalize(Color color)

{
  Vector4 VVar1;
  
  VVar1.x = (float)((uint)color & 0xff) / 255.0;
  VVar1.y = (float)((uint)color >> 8 & 0xff) / 255.0;
  VVar1.z = (float)((uint)color >> 0x10 & 0xff) / 255.0;
  VVar1.w = (float)((uint)color >> 0x18) / 255.0;
  return VVar1;
}

Assistant:

Vector4 ColorNormalize(Color color)
{
    Vector4 result;

    result.x = (float)color.r/255.0f;
    result.y = (float)color.g/255.0f;
    result.z = (float)color.b/255.0f;
    result.w = (float)color.a/255.0f;

    return result;
}